

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall State::State(State *this)

{
  Incppect<false> *pIVar1;
  Incppect<false> *pIVar2;
  undefined4 *in_RDI;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffb08;
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  *in_stack_fffffffffffffb10;
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  *this_00;
  allocator<char> *in_stack_fffffffffffffb30;
  allocator<char> *__a;
  char *in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_3a9;
  function local_3a8 [40];
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  local_380;
  allocator<char> local_359;
  function local_358 [79];
  allocator<char> local_309;
  function local_308 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  allocator<char> local_2b9;
  function local_2b8 [79];
  allocator<char> local_269;
  function local_268 [79];
  allocator<char> local_219;
  function local_218 [79];
  allocator<char> local_1c9;
  function local_1c8 [79];
  allocator<char> local_179;
  function local_178 [79];
  allocator<char> local_129;
  function local_128 [79];
  allocator<char> local_d9;
  function local_d8 [79];
  allocator<char> local_89;
  function local_88 [79];
  allocator<char> local_39;
  function local_38 [56];
  
  *in_RDI = 0;
  in_RDI[1] = 0x3a83126f;
  in_RDI[2] = 0;
  std::vector<Ball,_std::allocator<Ball>_>::vector((vector<Ball,_std::allocator<Ball>_> *)0x105c84);
  pIVar1 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_1_,void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Incppect<false>::var((string *)pIVar1,local_38);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x105d1f);
  std::__cxx11::string::~string((string *)local_38);
  std::allocator<char>::~allocator(&local_39);
  pIVar1 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_2_,void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Incppect<false>::var((string *)pIVar1,local_88);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x105dd4);
  std::__cxx11::string::~string((string *)local_88);
  std::allocator<char>::~allocator(&local_89);
  pIVar1 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_3_,void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Incppect<false>::var((string *)pIVar1,local_d8);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x105e89);
  std::__cxx11::string::~string((string *)local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pIVar1 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_4_,void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Incppect<false>::var((string *)pIVar1,local_128);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x105f3e);
  std::__cxx11::string::~string((string *)local_128);
  std::allocator<char>::~allocator(&local_129);
  pIVar1 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_5_,void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Incppect<false>::var((string *)pIVar1,local_178);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x105ff3);
  std::__cxx11::string::~string((string *)local_178);
  std::allocator<char>::~allocator(&local_179);
  pIVar1 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_6_,void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Incppect<false>::var((string *)pIVar1,local_1c8);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x1060a8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pIVar1 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_7_,void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Incppect<false>::var((string *)pIVar1,local_218);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x106157);
  std::__cxx11::string::~string((string *)local_218);
  std::allocator<char>::~allocator(&local_219);
  pIVar1 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_8_,void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Incppect<false>::var((string *)pIVar1,local_268);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x1061fa);
  std::__cxx11::string::~string((string *)local_268);
  std::allocator<char>::~allocator(&local_269);
  pIVar1 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  this_01 = &local_2e0;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_9_,void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Incppect<false>::var((string *)pIVar1,local_2b8);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x10629d);
  std::__cxx11::string::~string((string *)local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  pIVar1 = Incppect<false>::getInstance();
  __a = &local_309;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)pIVar1,__a);
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_10_,void>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Incppect<false>::var((string *)pIVar1,local_308);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x106340);
  std::__cxx11::string::~string((string *)local_308);
  std::allocator<char>::~allocator(&local_309);
  pIVar2 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)pIVar1,__a);
  this_00 = &local_380;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_11_,void>(this_00,in_stack_fffffffffffffb08);
  Incppect<false>::var((string *)pIVar2,local_358);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x1063e3);
  std::__cxx11::string::~string((string *)local_358);
  std::allocator<char>::~allocator(&local_359);
  pIVar2 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)pIVar1,__a);
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<State::State()::_lambda(auto:1_const&)_12_,void>
            (this_00,(anon_class_8_1_8991fb9c *)pIVar2);
  Incppect<false>::var((string *)pIVar2,local_3a8);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x106484);
  std::__cxx11::string::~string((string *)local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  return;
}

Assistant:

State() {
        incppect::getInstance().var("state.dt", [this](const auto & idxs) { return incppect::view(dt); });

        incppect::getInstance().var("state.nballs", [this](const auto & idxs) {
            static int n = 0;
            n = balls.size();
            return incppect::view(n);
        });

        incppect::getInstance().var("state.dt", [this](const auto & idxs) { return incppect::view(dt); });
        incppect::getInstance().var("state.energy", [this](const auto & idxs) { return incppect::view(energy); });

        incppect::getInstance().var("state.ball[%d].r", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].r); });
        incppect::getInstance().var("state.ball[%d].m", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].m); });
        incppect::getInstance().var("state.ball[%d].x", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].x); });
        incppect::getInstance().var("state.ball[%d].y", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].y); });
        incppect::getInstance().var("state.ball[%d].z", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].z); });
        incppect::getInstance().var("state.ball[%d].vx", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].vx); });
        incppect::getInstance().var("state.ball[%d].vy", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].vy); });
        incppect::getInstance().var("state.ball[%d].vz", [this](const auto & idxs) { return incppect::view(balls[idxs[0]].vz); });
    }